

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::dispose(Synth *this)

{
  Bit8u *pBVar1;
  Display *pDVar2;
  MidiEventQueue *this_00;
  PartialManager *this_01;
  int i;
  long lVar3;
  
  this->opened = false;
  pDVar2 = this->extensions->display;
  if (pDVar2 != (Display *)0x0) {
    operator_delete(pDVar2);
  }
  this->extensions->display = (Display *)0x0;
  this_00 = this->midiQueue;
  if (this_00 != (MidiEventQueue *)0x0) {
    MidiEventQueue::~MidiEventQueue(this_00);
    operator_delete(this_00);
  }
  this->midiQueue = (MidiEventQueue *)0x0;
  if (this->renderer != (Renderer *)0x0) {
    (*this->renderer->_vptr_Renderer[1])();
  }
  this->renderer = (Renderer *)0x0;
  if (this->analog != (Analog *)0x0) {
    (*this->analog->_vptr_Analog[1])();
  }
  this->analog = (Analog *)0x0;
  this_01 = this->partialManager;
  if (this_01 != (PartialManager *)0x0) {
    PartialManager::~PartialManager(this_01);
    operator_delete(this_01);
  }
  this->partialManager = (PartialManager *)0x0;
  lVar3 = 0x2030;
  do {
    if (*(long **)(this->controlROMData + lVar3 * 8 + -0x60) != (long *)0x0) {
      (**(code **)(**(long **)(this->controlROMData + lVar3 * 8 + -0x60) + 8))();
    }
    pBVar1 = this->controlROMData + lVar3 * 8 + -0x60;
    pBVar1[0] = '\0';
    pBVar1[1] = '\0';
    pBVar1[2] = '\0';
    pBVar1[3] = '\0';
    pBVar1[4] = '\0';
    pBVar1[5] = '\0';
    pBVar1[6] = '\0';
    pBVar1[7] = '\0';
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x2039);
  if (this->soundGroupNames != (char (*) [9])0x0) {
    operator_delete__(this->soundGroupNames);
  }
  this->soundGroupNames = (char (*) [9])0x0;
  if (this->pcmWaves != (PCMWaveEntry *)0x0) {
    operator_delete__(this->pcmWaves);
  }
  this->pcmWaves = (PCMWaveEntry *)0x0;
  if (this->pcmROMData != (Bit16s *)0x0) {
    operator_delete__(this->pcmROMData);
  }
  this->pcmROMData = (Bit16s *)0x0;
  deleteMemoryRegions(this);
  lVar3 = 0;
  do {
    if (this->reverbModels[lVar3] != (BReverbModel *)0x0) {
      (*this->reverbModels[lVar3]->_vptr_BReverbModel[1])();
    }
    this->reverbModels[lVar3] = (BReverbModel *)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  this->reverbModel = (BReverbModel *)0x0;
  this->controlROMFeatures = (ControlROMFeatureSet *)0x0;
  this->controlROMMap = (ControlROMMap *)0x0;
  return;
}

Assistant:

void Synth::dispose() {
	opened = false;

	delete extensions.display;
	extensions.display = NULL;

	delete midiQueue;
	midiQueue = NULL;

	delete renderer;
	renderer = NULL;

	delete analog;
	analog = NULL;

	delete partialManager;
	partialManager = NULL;

	for (int i = 0; i < 9; i++) {
		delete parts[i];
		parts[i] = NULL;
	}

	delete[] soundGroupNames;
	soundGroupNames = NULL;

	delete[] pcmWaves;
	pcmWaves = NULL;

	delete[] pcmROMData;
	pcmROMData = NULL;

	deleteMemoryRegions();

	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		delete reverbModels[i];
		reverbModels[i] = NULL;
	}
	reverbModel = NULL;
	controlROMFeatures = NULL;
	controlROMMap = NULL;
}